

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atf-c.c
# Opt level: O2

void microatf_context_write_result_pack
               (microatf_context_t *context,char *result,int arg,char *reason,__va_list_tag *args)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined4 in_register_00000014;
  char line [1024];
  char acStack_438 [1032];
  
  if (-1 < microatf_context_static.result_file) {
    if ((microatf_context_static.do_close_result_file) &&
       (iVar1 = ftruncate(microatf_context_static.result_file,0), iVar1 < 0)) {
      return;
    }
    uVar2 = snprintf(acStack_438,0x400,"%s",context);
    if (uVar2 < 0x400) {
      if ((int)result != -1) {
        uVar3 = snprintf(acStack_438 + uVar2,(ulong)(0x400 - uVar2),"(%d)",
                         (ulong)result & 0xffffffff);
        if (0x400 - uVar2 <= uVar3) {
          return;
        }
        uVar2 = uVar2 + uVar3;
      }
      if ((char *)CONCAT44(in_register_00000014,arg) != (char *)0x0) {
        iVar1 = snprintf(acStack_438 + uVar2,(long)(int)(0x400 - uVar2),": ");
        if ((int)(0x400 - uVar2) <= iVar1 || iVar1 < 0) {
          return;
        }
        uVar2 = iVar1 + uVar2;
        iVar1 = vsnprintf(acStack_438 + uVar2,(long)(int)(0x400 - uVar2),
                          (char *)CONCAT44(in_register_00000014,arg),reason);
        if ((int)(0x400 - uVar2) <= iVar1 || iVar1 < 0) {
          return;
        }
        uVar2 = iVar1 + uVar2;
      }
      iVar1 = snprintf(acStack_438 + uVar2,(long)(int)(0x400 - uVar2),"\n");
      if (iVar1 < (int)(0x400 - uVar2) && -1 < iVar1) {
        write(microatf_context_static.result_file,acStack_438,(ulong)(iVar1 + uVar2));
      }
    }
  }
  return;
}

Assistant:

static void
microatf_context_write_result_pack(microatf_context_t *context,
    char const *result, const int arg, char const *reason, va_list args)
{
	if (context->result_file < 0) {
		return;
	}

	if (context->do_close_result_file) {
		if (ftruncate(context->result_file, 0) < 0) {
			return;
		}
	}

	char line[1024];
	int line_size = 0;
	int r;

#define APP_IMPL(print_fun, ...)                                           \
	do {                                                               \
		r = print_fun(line + line_size, /**/                       \
		    (size_t)((int)sizeof(line) - line_size), __VA_ARGS__); \
		if (r < 0 || r >= ((int)sizeof(line) - line_size)) {       \
			return;                                            \
		}                                                          \
                                                                           \
		line_size += r;                                            \
	}